

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kapi.cpp
# Opt level: O1

int __thiscall Kraken::KAPI::init(KAPI *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  CURL *pCVar2;
  runtime_error *this_00;
  
  pCVar2 = (CURL *)curl_easy_init();
  this->curl_ = pCVar2;
  if (pCVar2 != (CURL *)0x0) {
    curl_easy_setopt(pCVar2,0x29,0);
    curl_easy_setopt(this->curl_,0x40,1);
    curl_easy_setopt(this->curl_,0x51,2);
    curl_easy_setopt(this->curl_,0x2722,"Kraken C++ API Client");
    curl_easy_setopt(this->curl_,0x2f,1);
    iVar1 = curl_easy_setopt(this->curl_,0x4e2b,write_cb);
    return iVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"can\'t create curl handle");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void KAPI::init()
{
   curl_ = curl_easy_init();
   if (curl_) {
      curl_easy_setopt(curl_, CURLOPT_VERBOSE, CURL_VERBOSE);
      curl_easy_setopt(curl_, CURLOPT_SSL_VERIFYPEER, 1L);
      curl_easy_setopt(curl_, CURLOPT_SSL_VERIFYHOST, 2L);
      curl_easy_setopt(curl_, CURLOPT_USERAGENT, "Kraken C++ API Client");
      curl_easy_setopt(curl_, CURLOPT_POST, 1L);
      // set callback function 
      curl_easy_setopt(curl_, CURLOPT_WRITEFUNCTION, KAPI::write_cb);
   }
   else {
      throw std::runtime_error("can't create curl handle");
   }
}